

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O1

void __thiscall CTcTokenizer::pp_charset(CTcTokenizer *this)

{
  int errnum;
  
  if (this->str_ == (CTcTokStream *)0x0) {
    errnum = 0x2714;
  }
  else {
    errnum = 0x2714 - ((byte)this->str_->field_0x28 & 1);
  }
  log_error(errnum);
  (this->linebuf_).buf_len_ = 0;
  if ((this->linebuf_).buf_size_ != 0) {
    *(this->linebuf_).buf_ = '\0';
  }
  (this->p_).p_ = (this->linebuf_).buf_;
  return;
}

Assistant:

void CTcTokenizer::pp_charset()
{
    /* 
     *   Encountering a #charset directive within the tokenizer is always
     *   an error.  If the file opener managed to use a #charset, we'll
     *   never see it, because the file opener will have skipped it before
     *   giving us the file.
     *   
     *   If we flagged a #charset error when opening the file, indicate
     *   that the problem is that the character set given was unloadable;
     *   otherwise, the problem is that #charset is in the wrong place.  
     */
    log_error(str_ != 0 && str_->get_charset_error()
              ? TCERR_CANT_LOAD_CHARSET : TCERR_UNEXPECTED_CHARSET);

    /* don't retain this pragma in the result */
    clear_linebuf();
}